

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O1

cio_bs_state internal_read_until(cio_buffered_stream *buffered_stream)

{
  cio_read_buffer *read_buffer;
  cio_bs_state cVar1;
  void *pvVar2;
  size_t sVar3;
  cio_error err;
  
  read_buffer = buffered_stream->read_buffer;
  err = buffered_stream->last_error;
  if (err == CIO_SUCCESS) {
    sVar3 = (buffered_stream->read_info).until.delim_length;
    pvVar2 = cio_memmem(read_buffer->fetch_ptr,
                        (long)read_buffer->add_ptr - (long)read_buffer->fetch_ptr,
                        (buffered_stream->read_info).until.delim,sVar3);
    if (pvVar2 == (void *)0x0) {
      return CIO_BS_AGAIN;
    }
    sVar3 = (long)pvVar2 + (sVar3 - (long)read_buffer->fetch_ptr);
    err = CIO_SUCCESS;
  }
  else {
    sVar3 = 0;
  }
  cVar1 = call_handler(buffered_stream,err,read_buffer,sVar3);
  return cVar1;
}

Assistant:

static enum cio_bs_state internal_read_until(struct cio_buffered_stream *buffered_stream)
{
	struct cio_read_buffer *read_buffer = buffered_stream->read_buffer;

	if (cio_unlikely(buffered_stream->last_error != CIO_SUCCESS)) {
		return call_handler(buffered_stream, buffered_stream->last_error, read_buffer, 0);
	}

	const uint8_t *haystack = read_buffer->fetch_ptr;
	const char *needle = buffered_stream->read_info.until.delim;
	size_t needle_length = buffered_stream->read_info.until.delim_length;
	const uint8_t *found = cio_memmem(haystack, cio_read_buffer_unread_bytes(read_buffer), needle, needle_length);
	if (found != NULL) {
		ptrdiff_t diff = (found + needle_length) - read_buffer->fetch_ptr;
		return call_handler(buffered_stream, CIO_SUCCESS, read_buffer, (size_t)diff);
	}

	return CIO_BS_AGAIN;
}